

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::prepareProgramDetails
          (ImageLoadStoreEarlyFragmentTestsTest *this,char *fragment_shader_code,
          char *geometry_shader_code,char *vertex_shader_code,programDetails *out_program_details)

{
  GLuint program;
  GLint GVar1;
  GLenum GVar2;
  GLint GVar3;
  InternalError *pIVar4;
  GLint image_uniform_location;
  GLint depth_uniform_location;
  bool local_31;
  GLuint program_id;
  bool is_program_built;
  programDetails *out_program_details_local;
  char *vertex_shader_code_local;
  char *geometry_shader_code_local;
  char *fragment_shader_code_local;
  ImageLoadStoreEarlyFragmentTestsTest *this_local;
  
  local_31 = true;
  _program_id = out_program_details;
  out_program_details_local = (programDetails *)vertex_shader_code;
  vertex_shader_code_local = geometry_shader_code;
  geometry_shader_code_local = fragment_shader_code;
  fragment_shader_code_local = (char *)this;
  program = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,vertex_shader_code,(char *)0x0,
                       (char *)0x0,geometry_shader_code,fragment_shader_code,&local_31);
  if ((local_31 & 1U) == 0) {
    pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar4,"Failed to build program","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x279b);
    __cxa_throw(pIVar4,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  GVar1 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,program,"u_depth");
  GVar2 = glu::CallLogWrapper::glGetError
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  glu::checkError(GVar2,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27a0);
  if (GVar1 == -1) {
    pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar4,"Uniform is not active","u_image",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x27a4);
    __cxa_throw(pIVar4,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,program,"u_image");
  GVar2 = glu::CallLogWrapper::glGetError
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  glu::checkError(GVar2,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27a9);
  if (GVar3 == -1) {
    pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar4,"Uniform is not active","u_image",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x27ad);
    __cxa_throw(pIVar4,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  _program_id->m_depth_uniform_location = GVar1;
  _program_id->m_image_uniform_location = GVar3;
  _program_id->m_program_id = program;
  return;
}

Assistant:

void prepareProgramDetails(const char* fragment_shader_code, const char* geometry_shader_code,
							   const char* vertex_shader_code, programDetails& out_program_details)
	{
		static const char* const depth_uniform_name = "u_depth";
		static const char* const image_uniform_name = "u_image";
		bool					 is_program_built   = true;

		GLuint program_id = BuildProgram(vertex_shader_code, 0 /* src_tcs */, 0 /* src_tes */, geometry_shader_code,
										 fragment_shader_code, &is_program_built);

		if (false == is_program_built)
		{
			throw tcu::InternalError("Failed to build program", "", __FILE__, __LINE__);
		}

		/* Get depth uniform location */
		GLint depth_uniform_location = glGetUniformLocation(program_id, depth_uniform_name);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetUniformLocation");

		if (m_invalid_uniform_location == depth_uniform_location)
		{
			throw tcu::InternalError("Uniform is not active", image_uniform_name, __FILE__, __LINE__);
		}

		/* Get image uniform location */
		GLint image_uniform_location = glGetUniformLocation(program_id, image_uniform_name);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetUniformLocation");

		if (m_invalid_uniform_location == image_uniform_location)
		{
			throw tcu::InternalError("Uniform is not active", image_uniform_name, __FILE__, __LINE__);
		}

		/* Store results */
		out_program_details.m_depth_uniform_location = depth_uniform_location;
		out_program_details.m_image_uniform_location = image_uniform_location;
		out_program_details.m_program_id			 = program_id;
	}